

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O3

size_t __thiscall
pbrt::BufferCache<pbrt::Vector3<float>_>::BufferHasher::operator()(BufferHasher *this,Buffer *b)

{
  long *plVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  pfVar2 = (float *)b->ptr;
  uVar5 = (uint)b->size;
  uVar3 = (long)(int)uVar5 * -0x395b586ca42e166b;
  uVar6 = uVar5;
  if ((int)uVar5 < 0) {
    uVar6 = uVar5 + 7;
  }
  pfVar4 = pfVar2;
  if (0xe < uVar5 + 7) {
    lVar7 = 0;
    pfVar4 = pfVar2 + (long)((int)uVar6 >> 3) * 2;
    do {
      plVar1 = (long *)((long)pfVar2 + lVar7);
      lVar7 = lVar7 + 8;
      uVar8 = *plVar1 * -0x395b586ca42e166b;
      uVar3 = (uVar3 ^ (uVar8 >> 0x2f ^ uVar8) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
    } while ((long)((int)uVar6 >> 3) * 8 != lVar7);
  }
  switch(uVar5 & 7) {
  case 7:
    uVar3 = uVar3 ^ (ulong)*(byte *)&((Tuple3<pbrt::Vector3,_float> *)((long)pfVar4 + 6))->x << 0x30
    ;
  case 6:
    uVar3 = uVar3 ^ (ulong)*(byte *)&((Tuple3<pbrt::Vector3,_float> *)((long)pfVar4 + 5))->x << 0x28
    ;
  case 5:
    uVar3 = uVar3 ^ (ulong)*(byte *)&((Tuple3<pbrt::Vector3,_float> *)(pfVar4 + 1))->x << 0x20;
  case 4:
    uVar3 = uVar3 ^ (ulong)*(byte *)&((Tuple3<pbrt::Vector3,_float> *)((long)pfVar4 + 3))->x << 0x18
    ;
  case 3:
    uVar3 = uVar3 ^ (ulong)*(byte *)&((Tuple3<pbrt::Vector3,_float> *)((long)pfVar4 + 2))->x << 0x10
    ;
  case 2:
    uVar3 = uVar3 ^ (ulong)*(byte *)&((Tuple3<pbrt::Vector3,_float> *)((long)pfVar4 + 1))->x << 8;
  case 1:
    uVar3 = (*(byte *)pfVar4 ^ uVar3) * -0x395b586ca42e166b;
  case 0:
    uVar3 = (uVar3 >> 0x2f ^ uVar3) * -0x395b586ca42e166b;
    return uVar3 >> 0x2f ^ uVar3;
  }
}

Assistant:

size_t operator()(const Buffer &b) const { return HashBuffer(b.ptr, b.size); }